

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_encoder.cc
# Opt level: O2

EncodedInfo * __thiscall
webrtc::AudioEncoder::Encode
          (EncodedInfo *__return_storage_ptr__,AudioEncoder *this,uint32_t rtp_timestamp,
          ArrayView<const_short> audio,Buffer *encoded)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  string *psVar3;
  size_t sVar4;
  undefined8 local_1e8;
  undefined8 local_1e0;
  ArrayView<const_short> audio_local;
  TraceEndOnScopeClose trace_event_unique_profileScope32;
  ulong local_1b0;
  FatalMessage local_1a8;
  
  sVar4 = audio.size_;
  audio_local.data_ = audio.data_;
  audio_local.size_ = sVar4;
  if (Encode::trace_event_unique_catstatic32 == (uchar *)0x0) {
    Encode::trace_event_unique_catstatic32 = EventTracer::GetCategoryEnabled("webrtc");
  }
  trace_event_unique_profileScope32.p_data_ = (Data *)0x0;
  if (*Encode::trace_event_unique_catstatic32 != '\0') {
    EventTracer::AddTraceEvent
              ('B',Encode::trace_event_unique_catstatic32,"AudioEncoder::Encode",0,0,(char **)0x0,
               (uchar *)0x0,(unsigned_long_long *)0x0,'\0');
    trace_event_unique_profileScope32.p_data_ = &trace_event_unique_profileScope32.data_;
    trace_event_unique_profileScope32.data_.category_enabled =
         Encode::trace_event_unique_catstatic32;
    trace_event_unique_profileScope32.data_.name = "AudioEncoder::Encode";
  }
  local_1a8._0_8_ = sVar4;
  iVar1 = (*this->_vptr_AudioEncoder[3])(this);
  iVar2 = (*this->_vptr_AudioEncoder[2])(this);
  local_1b0 = (ulong)(CONCAT44(extraout_var,iVar1) * (long)iVar2) / 100;
  psVar3 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                     ((unsigned_long *)&local_1a8,&local_1b0,
                      "audio.size() == static_cast<size_t>(NumChannels() * SampleRateHz() / 100)");
  if (psVar3 == (string *)0x0) {
    sVar4 = rtc::Buffer::size(encoded);
    rtc::ArrayView<short_const>::ArrayView<rtc::ArrayView<short_const>>
              ((ArrayView<short_const> *)&local_1e8,&audio_local);
    (*this->_vptr_AudioEncoder[0xf])
              (__return_storage_ptr__,this,(ulong)rtp_timestamp,local_1e8,local_1e0,encoded);
    local_1a8._0_8_ = rtc::Buffer::size(encoded);
    local_1a8._0_8_ = local_1a8._0_8_ - sVar4;
    psVar3 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                       ((unsigned_long *)&local_1a8,(unsigned_long *)__return_storage_ptr__,
                        "encoded->size() - old_size == info.encoded_bytes");
    if (psVar3 == (string *)0x0) {
      trace_event_internal::TraceEndOnScopeClose::~TraceEndOnScopeClose
                (&trace_event_unique_profileScope32);
      return __return_storage_ptr__;
    }
    rtc::FatalMessage::FatalMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/audio_encoder.cc"
               ,0x26,psVar3);
  }
  else {
    rtc::FatalMessage::FatalMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/audio_encoder.cc"
               ,0x22,psVar3);
  }
  rtc::FatalMessage::~FatalMessage(&local_1a8);
}

Assistant:

AudioEncoder::EncodedInfo AudioEncoder::Encode(
    uint32_t rtp_timestamp,
    rtc::ArrayView<const int16_t> audio,
    rtc::Buffer* encoded) {
  TRACE_EVENT0("webrtc", "AudioEncoder::Encode");
  RTC_CHECK_EQ(audio.size(),
               static_cast<size_t>(NumChannels() * SampleRateHz() / 100));

  const size_t old_size = encoded->size();
  EncodedInfo info = EncodeImpl(rtp_timestamp, audio, encoded);
  RTC_CHECK_EQ(encoded->size() - old_size, info.encoded_bytes);
  return info;
}